

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O2

void __thiscall
dynet::BidirectionalTreeLSTMBuilder::BidirectionalTreeLSTMBuilder
          (BidirectionalTreeLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  ParameterCollection *this_00;
  allocator local_231;
  VanillaLSTMBuilder *local_230;
  VanillaLSTMBuilder *local_228;
  string local_220;
  VanillaLSTMBuilder local_200;
  
  (this->super_TreeLSTMBuilder).super_RNNBuilder.cur = -1;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.sm.q_ = CREATED;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder._vptr_RNNBuilder =
       (_func_int **)&PTR__BidirectionalTreeLSTMBuilder_007106c8;
  local_228 = &this->fwd_node_builder;
  VanillaLSTMBuilder::VanillaLSTMBuilder(local_228);
  local_230 = &this->rev_node_builder;
  VanillaLSTMBuilder::VanillaLSTMBuilder(local_230);
  (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->local_model;
  ParameterCollection::ParameterCollection(this_00);
  std::__cxx11::string::string((string *)&local_220,"bidirectional-tree-lstm-builder",&local_231);
  ParameterCollection::add_subcollection((ParameterCollection *)&local_200,model,&local_220);
  ParameterCollection::operator=(this_00,(ParameterCollection *)&local_200);
  ParameterCollection::~ParameterCollection((ParameterCollection *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  VanillaLSTMBuilder::VanillaLSTMBuilder(&local_200,layers,input_dim,hidden_dim >> 1,this_00,false);
  VanillaLSTMBuilder::operator=(local_228,&local_200);
  VanillaLSTMBuilder::~VanillaLSTMBuilder(&local_200);
  VanillaLSTMBuilder::VanillaLSTMBuilder(&local_200,layers,input_dim,hidden_dim >> 1,this_00,false);
  VanillaLSTMBuilder::operator=(local_230,&local_200);
  VanillaLSTMBuilder::~VanillaLSTMBuilder(&local_200);
  return;
}

Assistant:

BidirectionalTreeLSTMBuilder::BidirectionalTreeLSTMBuilder(unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         ParameterCollection& model) {
  DYNET_ASSERT(hidden_dim % 2 == 0, "Failed dimension check in TreeLSTMBuilder");
  local_model = model.add_subcollection("bidirectional-tree-lstm-builder");
  fwd_node_builder = LSTMBuilder(layers, input_dim, hidden_dim / 2, local_model);
  rev_node_builder = LSTMBuilder(layers, input_dim, hidden_dim / 2, local_model);
}